

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O3

int32_t al_ustr_get(ALLEGRO_USTR *ub,int pos)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int32_t iVar4;
  int errnum;
  long lVar5;
  uint uVar6;
  int iVar7;
  
  iVar4 = -1;
  errnum = 0x22;
  if (ub != (ALLEGRO_USTR *)0x0) {
    uVar6 = 0;
    if (0 < ub->slen) {
      uVar6 = ub->slen;
    }
    if ((uint)pos < uVar6) {
      bVar1 = ub->data[(uint)pos];
      if (-1 < (char)bVar1) {
        return (uint)bVar1;
      }
      iVar4 = -2;
      errnum = 0x54;
      if (0xc1 < bVar1) {
        if (bVar1 < 0xe0) {
          iVar3 = 0x80;
          iVar7 = 1;
          uVar2 = 0x1f;
        }
        else if (bVar1 < 0xf0) {
          iVar3 = 0x800;
          iVar7 = 2;
          uVar2 = 0xf;
        }
        else {
          if (0xf4 < bVar1) goto LAB_00180fdb;
          iVar3 = 0x10000;
          iVar7 = 3;
          uVar2 = 7;
        }
        if ((uint)(pos + iVar7) <= uVar6) {
          uVar2 = bVar1 & uVar2;
          lVar5 = 0;
          do {
            uVar6 = (uint)ub->data[lVar5 + (ulong)(uint)pos + 1];
            if ((uVar6 & 0xffffffc0) != 0x80) goto LAB_00180fdb;
            uVar2 = uVar6 & 0x3f | uVar2 << 6;
            lVar5 = lVar5 + 1;
          } while (iVar7 != (int)lVar5);
          if (iVar3 <= (int)uVar2) {
            return uVar2;
          }
        }
      }
    }
  }
LAB_00180fdb:
  al_set_errno(errnum);
  return iVar4;
}

Assistant:

int32_t al_ustr_get(const ALLEGRO_USTR *ub, int pos)
{
   int32_t c;
   int remain;
   int32_t minc;
   const unsigned char *data;

   c = _al_bchare(ub, pos, -1);

   if (c < 0) {
      /* Out of bounds. */
      al_set_errno(ERANGE);
      return -1;
   }

   if (c <= 0x7F) {
      /* Plain ASCII. */
      return c;
   }

   if (c <= 0xC1) {
      /* Trailing byte of multi-byte sequence or an overlong encoding for
       * code point <= 127.
       */
      al_set_errno(EILSEQ);
      return -2;
   }

   if (c <= 0xDF) {
      /* 2-byte sequence. */
      c &= 0x1F;
      remain = 1;
      minc = 0x80;
   }
   else if (c <= 0xEF) {
      /* 3-byte sequence. */
      c &= 0x0F;
      remain = 2;
      minc = 0x800;
   }
   else if (c <= 0xF4) {
      /* 4-byte sequence. */
      c &= 0x07;
      remain = 3;
      minc = 0x10000;
   }
   else {
      /* Otherwise invalid. */
      al_set_errno(EILSEQ);
      return -2;
   }

   if (pos + remain > _al_blength(ub)) {
      al_set_errno(EILSEQ);
      return -2;
   }

   data = (const unsigned char *) _al_bdata(ub);
   while (remain--) {
      int d = data[++pos];

      if (!IS_TRAIL_BYTE(d)) {
         al_set_errno(EILSEQ);
         return -2;
      }

      c = (c << 6) | (d & 0x3F);
   }

   /* Check for overlong forms, which could be used to bypass security
    * validations.  We could also check code points aren't above U+10FFFF or in
    * the surrogate ranges, but we don't.
    */

   if (c < minc) {
      al_set_errno(EILSEQ);
      return -2;
   }

   return c;
}